

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_str_recv(void *arg,nng_aio *aio)

{
  _Bool _Var1;
  nng_aio *pnVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  _Var1 = nni_aio_start(aio,ws_read_cancel,arg);
  if (_Var1) {
    nni_list_append((nni_list *)((long)arg + 0xa0),aio);
    pnVar2 = (nng_aio *)nni_list_first((nni_list *)((long)arg + 0xa0));
    if (pnVar2 == aio) {
      ws_read_finish((nni_ws *)arg);
    }
    ws_start_read((nni_ws *)arg);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ws_str_recv(void *arg, nng_aio *aio)
{
	nni_ws *ws = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ws->mtx);
	if (!nni_aio_start(aio, ws_read_cancel, ws)) {
		nni_mtx_unlock(&ws->mtx);
		return;
	}
	nni_list_append(&ws->recvq, aio);
	if (nni_list_first(&ws->recvq) == aio) {
		ws_read_finish(ws);
	}
	ws_start_read(ws);

	nni_mtx_unlock(&ws->mtx);
}